

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O0

size_t __thiscall
CCharmapToLocalWideUnicode::map_utf8z
          (CCharmapToLocalWideUnicode *this,char *dest,size_t dest_len,utf8_ptr src)

{
  wchar_t wVar1;
  ulong in_RDX;
  utf8_ptr *in_RSI;
  wchar_t *destw;
  size_t cur_total;
  size_t local_28;
  ulong local_20;
  
  local_28 = 0;
  local_20 = in_RDX;
  while( true ) {
    wVar1 = utf8_ptr::getch((utf8_ptr *)0x291ff5);
    if (wVar1 == L'\0') break;
    if (local_20 < 4) {
      local_20 = 0;
    }
    else {
      wVar1 = utf8_ptr::getch((utf8_ptr *)0x29200c);
      *(wchar_t *)&in_RSI->p_ = wVar1;
      local_20 = local_20 - 4;
      in_RSI = (utf8_ptr *)((long)&in_RSI->p_ + 4);
    }
    local_28 = local_28 + 4;
    utf8_ptr::inc(in_RSI);
  }
  if (3 < local_20) {
    *(undefined4 *)&in_RSI->p_ = 0;
  }
  return local_28;
}

Assistant:

size_t CCharmapToLocalWideUnicode::
   map_utf8z(char *dest, size_t dest_len, utf8_ptr src) const
{
    size_t cur_total;
    wchar_t *destw;

    /* set up a wchar_t output pointer for convenience */
    destw = (wchar_t *)dest;

    /* copy characters until we find the terminating null */
    for (cur_total = 0 ; src.getch() != 0 ; src.inc())
    {
        /* 
         *   if we have room, add it; otherwise, zero the output length
         *   remaining so we don't try to add anything more 
         */
        if (dest_len >= sizeof(wchar_t))
        {
            /* add the sequence */
            *destw++ = src.getch();

            /* adjust the length remaining */
            dest_len -= sizeof(wchar_t);
        }
        else
        {
            /* it doesn't fit - zero the output length remaining */
            dest_len = 0;
        }

        /* count the length in the total */
        cur_total += sizeof(wchar_t);
    }

    /* 
     *   if there's room for a null terminator character (not byte - we need
     *   to add an entire wide character), add it, but don't count it in the
     *   return length 
     */
    if (dest_len >= sizeof(wchar_t))
        *destw = '\0';
    
    /* return the total length of the result */
    return cur_total;
}